

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

void Rml::ReleaseCompiledGeometry(RenderInterface *match_render_interface)

{
  bool bVar1;
  CoreData *pCVar2;
  reference ppVar3;
  pointer render_manager_00;
  pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>
  *render_manager;
  iterator __end1;
  iterator __begin1;
  SmallUnorderedMap<RenderInterface_*,_UniquePtr<RenderManager>_> *__range1;
  RenderInterface *match_render_interface_local;
  
  bVar1 = ControlledLifetimeResource::operator_cast_to_bool((ControlledLifetimeResource *)core_data)
  ;
  if (bVar1) {
    pCVar2 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    __end1 = itlib::
             flat_map<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>,_itlib::fmimpl::less,_std::vector<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>_>
             ::begin(&pCVar2->render_managers);
    render_manager =
         (pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>
          *)itlib::
            flat_map<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>,_itlib::fmimpl::less,_std::vector<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>_>
            ::end(&pCVar2->render_managers);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_*,_std::vector<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>_>
                                       *)&render_manager), bVar1) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_*,_std::vector<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>_>
               ::operator*(&__end1);
      if ((match_render_interface == (RenderInterface *)0x0) ||
         (ppVar3->first == match_render_interface)) {
        render_manager_00 =
             ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::get
                       (&ppVar3->second);
        RenderManagerAccess::ReleaseAllCompiledGeometry(render_manager_00);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_*,_std::vector<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>,_std::allocator<std::pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void ReleaseCompiledGeometry(RenderInterface* match_render_interface)
{
	if (!core_data)
		return;
	for (auto& render_manager : core_data->render_managers)
	{
		if (!match_render_interface || render_manager.first == match_render_interface)
			RenderManagerAccess::ReleaseAllCompiledGeometry(render_manager.second.get());
	}
}